

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

boundaries __thiscall fmt::v6::internal::fp::assign_with_boundaries<double>(fp *this,double d)

{
  boundaries bVar1;
  undefined8 extraout_RDX;
  long *in_RDI;
  fp fVar2;
  fp upper;
  fp lower;
  bool is_lower_closer;
  fp local_58;
  double in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  fp local_38;
  undefined1 local_21;
  
  local_21 = assign<double,_0>((fp *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               in_stack_ffffffffffffffb8);
  if ((bool)local_21) {
    fp(&local_38,*in_RDI * 4 - 1,(int)in_RDI[1] + -2);
  }
  else {
    fp(&local_38,*in_RDI * 2 - 1,(int)in_RDI[1] + -1);
  }
  fp(&local_58,*in_RDI * 2 + 1,(int)in_RDI[1] + -1);
  fVar2.f = (ulong)(uint)local_58.e;
  fVar2._8_8_ = extraout_RDX;
  fVar2 = normalize<1>((internal *)local_58.f,fVar2);
  bVar1.upper = fVar2.f;
  bVar1.lower = local_38.f << ((char)local_38.e - (char)fVar2.e & 0x3fU);
  return bVar1;
}

Assistant:

boundaries assign_with_boundaries(Double d) {
    bool is_lower_closer = assign(d);
    fp lower =
        is_lower_closer ? fp((f << 2) - 1, e - 2) : fp((f << 1) - 1, e - 1);
    // 1 in normalize accounts for the exponent shift above.
    fp upper = normalize<1>(fp((f << 1) + 1, e - 1));
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }